

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O3

void __thiscall ncnn::PriorBox::PriorBox(PriorBox *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__PriorBox_005e45f8;
  (this->aspect_ratios).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->min_sizes).data = (void *)0x0;
  (this->min_sizes).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->min_sizes).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->min_sizes).elemsize + 4) = 0;
  (this->min_sizes).allocator = (Allocator *)0x0;
  (this->min_sizes).dims = 0;
  (this->min_sizes).w = 0;
  (this->min_sizes).w = 0;
  (this->min_sizes).h = 0;
  (this->min_sizes).d = 0;
  (this->min_sizes).c = 0;
  (this->min_sizes).cstep = 0;
  (this->max_sizes).data = (void *)0x0;
  (this->max_sizes).refcount = (int *)0x0;
  (this->max_sizes).elemsize = 0;
  (this->max_sizes).elempack = 0;
  (this->max_sizes).allocator = (Allocator *)0x0;
  (this->max_sizes).dims = 0;
  (this->max_sizes).w = 0;
  (this->max_sizes).w = 0;
  (this->max_sizes).h = 0;
  (this->max_sizes).d = 0;
  (this->max_sizes).c = 0;
  (this->max_sizes).cstep = 0;
  (this->aspect_ratios).data = (void *)0x0;
  (this->aspect_ratios).refcount = (int *)0x0;
  (this->aspect_ratios).elemsize = 0;
  (this->aspect_ratios).elempack = 0;
  (this->aspect_ratios).allocator = (Allocator *)0x0;
  (this->aspect_ratios).dims = 0;
  (this->aspect_ratios).w = 0;
  (this->aspect_ratios).w = 0;
  (this->aspect_ratios).h = 0;
  (this->aspect_ratios).d = 0;
  (this->aspect_ratios).c = 0;
  return;
}

Assistant:

PriorBox::PriorBox()
{
    one_blob_only = false;
    support_inplace = false;
}